

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_norm_wt_mmie_var
               (vector_t ***in_var,vector_t ***wt_var,vector_t ***wt_num_var,vector_t ***wt_den_var,
               float32 ***num_dnom,float32 ***den_dnom,vector_t ***in_mean,vector_t ***wt_mean,
               vector_t ***wt_num_mean,vector_t ***wt_den_mean,uint32 n_mgau,uint32 n_feat,
               uint32 n_density,uint32 *veclen,float32 constE)

{
  float32 fVar1;
  uint local_4c;
  float32 d_mmi;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  float32 constE_local;
  float32 ***den_dnom_local;
  float32 ***num_dnom_local;
  vector_t ***wt_den_var_local;
  vector_t ***wt_num_var_local;
  vector_t ***wt_var_local;
  vector_t ***in_var_local;
  
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (d_mmi = 0.0; (uint)d_mmi < n_density; d_mmi = (float32)((int)d_mmi + 1)) {
        if (((((float)num_dnom[k][l][(uint)d_mmi] != 0.0) ||
             (NAN((float)num_dnom[k][l][(uint)d_mmi]))) ||
            ((float)den_dnom[k][l][(uint)d_mmi] != 0.0)) ||
           (NAN((float)den_dnom[k][l][(uint)d_mmi]))) {
          fVar1 = cal_constD(in_mean[k][l][(uint)d_mmi],wt_num_mean[k][l][(uint)d_mmi],
                             wt_den_mean[k][l][(uint)d_mmi],in_var[k][l][(uint)d_mmi],
                             wt_num_var[k][l][(uint)d_mmi],wt_den_var[k][l][(uint)d_mmi],
                             num_dnom[k][l][(uint)d_mmi],den_dnom[k][l][(uint)d_mmi],veclen[l],
                             constE);
          if ((uint)ABS((float)fVar1) < 0x7f800000) {
            for (local_4c = 0; local_4c < veclen[l]; local_4c = local_4c + 1) {
              wt_var[k][l][(uint)d_mmi][local_4c] =
                   -wt_mean[k][l][(uint)d_mmi][local_4c] * wt_mean[k][l][(uint)d_mmi][local_4c] +
                   ((float)fVar1 *
                    (in_mean[k][l][(uint)d_mmi][local_4c] * in_mean[k][l][(uint)d_mmi][local_4c] +
                    in_var[k][l][(uint)d_mmi][local_4c]) +
                   (wt_num_var[k][l][(uint)d_mmi][local_4c] -
                   wt_den_var[k][l][(uint)d_mmi][local_4c])) /
                   (((float)num_dnom[k][l][(uint)d_mmi] - (float)den_dnom[k][l][(uint)d_mmi]) +
                   (float)fVar1);
              if ((uint)ABS(wt_var[k][l][(uint)d_mmi][local_4c]) < 0x7f800000) {
                if (wt_var[k][l][(uint)d_mmi][local_4c] <= 0.0 &&
                    wt_var[k][l][(uint)d_mmi][local_4c] != 0.0) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x870,
                          "Variance of the senone (mgau= %u, feat= %u, density=%u, component=%u) < 0\n"
                          ,(ulong)k,(ulong)l,d_mmi,local_4c);
                  wt_var[k][l][(uint)d_mmi][local_4c] = in_var[k][l][(uint)d_mmi][local_4c];
                }
              }
              else {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,0x869,
                        "The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n"
                        ,(double)wt_var[k][l][(uint)d_mmi][local_4c],(ulong)k,(ulong)l,d_mmi,
                        local_4c);
                wt_var[k][l][(uint)d_mmi][local_4c] = in_var[k][l][(uint)d_mmi][local_4c];
              }
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x85b,
                    "Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n"
                    ,(double)(float)fVar1,(ulong)k,(ulong)l,d_mmi);
            for (local_4c = 0; local_4c < veclen[l]; local_4c = local_4c + 1) {
              wt_var[k][l][(uint)d_mmi][local_4c] = in_var[k][l][(uint)d_mmi][local_4c];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_norm_wt_mmie_var(vector_t ***in_var,
			vector_t ***wt_var,
			vector_t ***wt_num_var,
			vector_t ***wt_den_var,
			float32 ***num_dnom,
			float32 ***den_dnom,
			vector_t ***in_mean,
			vector_t ***wt_mean,
			vector_t ***wt_num_mean,
			vector_t ***wt_den_mean,
			uint32 n_mgau,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen,
			float32 constE)
{
    uint32 i, j, k, l;
    float32 d_mmi = 0.0;
    
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (num_dnom[i][j][k] != 0 || den_dnom[i][j][k] != 0) {
		        
		    /* compute constant D, which controls the convergence speed and accuracy */
		    d_mmi = cal_constD(in_mean[i][j][k], wt_num_mean[i][j][k], wt_den_mean[i][j][k],
				       in_var[i][j][k], wt_num_var[i][j][k], wt_den_var[i][j][k], num_dnom[i][j][k], den_dnom[i][j][k], veclen[j], constE);
		    if (!finite(d_mmi)) {
			E_ERROR("Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n", d_mmi, i, j, k);
    			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
    			}
			continue;
		    }
		        
		    /* update variance parameters */
		    for (l = 0; l < veclen[j]; l++) {
			wt_var[i][j][k][l] = ((wt_num_var[i][j][k][l] - wt_den_var[i][j][k][l]) + 
					      d_mmi * (in_var[i][j][k][l] + in_mean[i][j][k][l] * in_mean[i][j][k][l])) / 
			    (num_dnom[i][j][k] - den_dnom[i][j][k] + d_mmi)
			    - (wt_mean[i][j][k][l] * wt_mean[i][j][k][l]);
			if (!finite(wt_var[i][j][k][l])) {
			    E_ERROR("The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n", wt_var[i][j][k][l], i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			    continue;
			}
			
			/* if the new var<0, keep it unchanged */
			if (wt_var[i][j][k][l] < 0) {
			    E_ERROR("Variance of the senone (mgau= %u, feat= %u, ""density=%u, component=%u) < 0\n", i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}